

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

char * mbedtls_ssl_get_ciphersuite_name(int ciphersuite_id)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_ciphersuite_t *cur;
  char *pcStack_10;
  int ciphersuite_id_local;
  
  pmVar1 = mbedtls_ssl_ciphersuite_from_id(ciphersuite_id);
  if (pmVar1 == (mbedtls_ssl_ciphersuite_t *)0x0) {
    pcStack_10 = "unknown";
  }
  else {
    pcStack_10 = pmVar1->name;
  }
  return pcStack_10;
}

Assistant:

const char *mbedtls_ssl_get_ciphersuite_name( const int ciphersuite_id )
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_id( ciphersuite_id );

    if( cur == NULL )
        return( "unknown" );

    return( cur->name );
}